

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseSet.h
# Opt level: O2

bool __thiscall SparseSet<0>::elem(SparseSet<0> *this,uint value)

{
  bool bVar1;
  
  if ((this->members <= this->sparse[value]) ||
     (bVar1 = true, this->dense[this->sparse[value]] != value)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool elem(unsigned int value) const 
  {
    if( U&1 )
    {
      return (sparse[value] < members);
    } 
    else 
    {
      unsigned int a = sparse[value];
      if( a < members && dense[a] == value )
        return true;
      return false;
    }
  }